

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.hpp
# Opt level: O2

void __thiscall
vk::BinaryRegistryDetail::ProgramNotFoundException::ProgramNotFoundException
          (ProgramNotFoundException *this,ProgramIdentifier *id,string *reason)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::operator+(&local_40,"Program ",&id->testCasePath);
  std::operator+(&local_c0,&local_40," / \'");
  std::operator+(&local_a0,&local_c0,&id->programName);
  std::operator+(&local_80,&local_a0,"\' not found: ");
  std::operator+(&local_60,&local_80,reason);
  tcu::ResourceError::ResourceError(&this->super_ResourceError,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_40);
  *(undefined ***)&(this->super_ResourceError).super_TestException.super_Exception =
       &PTR__Exception_00bf5f00;
  return;
}

Assistant:

ProgramNotFoundException (const ProgramIdentifier& id, const std::string& reason)
		: tcu::ResourceError("Program " + id.testCasePath + " / '" + id.programName + "' not found: " + reason)
	{
	}